

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

WebSocketPipe * kj::newWebSocketPipe(void)

{
  WebSocketPipeImpl **ppWVar1;
  uint *puVar2;
  WebSocketPipeEnd *pWVar3;
  WebSocketPipe *in_RDI;
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> end2;
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> end1;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> pipe2;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> pipe1;
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> local_58;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> local_48;
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t> local_38;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> local_28;
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> local_18;
  
  rc<kj::(anonymous_namespace)::WebSocketPipeImpl>();
  rc<kj::(anonymous_namespace)::WebSocketPipeImpl>();
  if (local_18.own.ptr == (WebSocketPipeImpl *)0x0) {
    local_58.disposer = (Disposer *)0x0;
    local_58.ptr = (WebSocketPipeEnd *)0x0;
  }
  else {
    ppWVar1 = (WebSocketPipeImpl **)&((local_18.own.ptr)->super_Refcounted).refcount;
    *(int *)ppWVar1 = *(int *)ppWVar1 + 1;
    local_58.disposer = &((local_18.own.ptr)->super_Refcounted).super_Disposer;
    local_58.ptr = (WebSocketPipeEnd *)local_18.own.ptr;
  }
  if (local_28.own.ptr == (WebSocketPipeImpl *)0x0) {
    local_48.own.disposer = (Disposer *)0x0;
    local_48.own.ptr = (WebSocketPipeImpl *)0x0;
  }
  else {
    puVar2 = &((local_28.own.ptr)->super_Refcounted).refcount;
    *puVar2 = *puVar2 + 1;
    local_48.own.disposer = &((local_28.own.ptr)->super_Refcounted).super_Disposer;
    local_48.own.ptr = local_28.own.ptr;
  }
  heap<kj::(anonymous_namespace)::WebSocketPipeEnd,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>>
            ((kj *)&local_38,(Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&local_58,&local_48
            );
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc(&local_48);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc
            ((Rc<kj::(anonymous_namespace)::WebSocketPipeImpl> *)&local_58);
  heap<kj::(anonymous_namespace)::WebSocketPipeEnd,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>,kj::Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>>
            ((kj *)&local_58,&local_28,&local_18);
  pWVar3 = local_38.ptr;
  local_38.ptr = (WebSocketPipeEnd *)0x0;
  in_RDI->ends[0].disposer = local_38.disposer;
  in_RDI->ends[0].ptr = &pWVar3->super_WebSocket;
  in_RDI->ends[1].disposer = local_58.disposer;
  in_RDI->ends[1].ptr = &(local_58.ptr)->super_WebSocket;
  local_58.ptr = (WebSocketPipeEnd *)0x0;
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t>::~Own(&local_58);
  Own<kj::(anonymous_namespace)::WebSocketPipeEnd,_std::nullptr_t>::~Own(&local_38);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc(&local_28);
  Rc<kj::(anonymous_namespace)::WebSocketPipeImpl>::~Rc(&local_18);
  return in_RDI;
}

Assistant:

WebSocketPipe newWebSocketPipe() {
  auto pipe1 = kj::rc<WebSocketPipeImpl>();
  auto pipe2 = kj::rc<WebSocketPipeImpl>();

  auto end1 = kj::heap<WebSocketPipeEnd>(pipe1.addRef(), pipe2.addRef());
  auto end2 = kj::heap<WebSocketPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));

  return { { kj::mv(end1), kj::mv(end2) } };
}